

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>::fastAccessDx
          (FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_> *this,int i)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  
  dVar1 = (this->left_->dx_).ptr_to_data[i];
  vVar3 = FadFuncCosh<Fad<double>_>::val(&this->right_->fadexpr_);
  vVar4 = FadFuncCosh<Fad<double>_>::fastAccessDx(&this->right_->fadexpr_,i);
  dVar2 = this->left_->val_;
  vVar5 = FadFuncCosh<Fad<double>_>::val(&this->right_->fadexpr_);
  vVar6 = FadFuncCosh<Fad<double>_>::val(&this->right_->fadexpr_);
  return (vVar3 * dVar1 - vVar4 * dVar2) / (vVar6 * vVar5);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}